

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_protective_shield(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  bVar1 = is_affected(ch,sn);
  if (bVar1) {
    txt = "You are already protected by a protective shield.\n\r";
  }
  else {
    bVar1 = is_affected_by(ch,0xe);
    if (!bVar1) {
      init_affect(&AStack_88);
      AStack_88.where = 0;
      AStack_88.aftype = get_spell_aftype(ch);
      AStack_88.location = 0;
      AStack_88.modifier = 0;
      AStack_88.duration =
           ((short)(uint)((ulong)((long)level * 0x66666667) >> 0x21) - (short)(level >> 0x1f)) + 5;
      AStack_88.level = (short)level;
      AStack_88.mod_name = 8;
      AStack_88.type = (short)sn;
      affect_to_char(ch,&AStack_88);
      act("$n is surrounded by a protective shield.",ch,(void *)0x0,(void *)0x0,0);
      send_to_char("You are surrounded by a protective shield.\n\r",ch);
      return;
    }
    txt = "You cannot concentrate enough to maintain a protective shield while in a rage.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_protective_shield(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, sn))
	{
		send_to_char("You are already protected by a protective shield.\n\r", ch);
		return;
	}

	if (is_affected_by(ch, AFF_RAGE))
	{
		send_to_char("You cannot concentrate enough to maintain a protective shield while in a rage.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.location = 0;
	af.modifier = 0;
	af.duration = 5 + level / 5;
	af.type = sn;
	af.level = level;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	act("$n is surrounded by a protective shield.", ch, 0, 0, TO_ROOM);
	send_to_char("You are surrounded by a protective shield.\n\r", ch);
}